

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

bool __thiscall JetHead::Socket::setKeepAlive(Socket *this,int timeout)

{
  int iVar1;
  int level;
  char *fmt;
  int probes;
  int interval;
  int aliveTime;
  int one;
  int local_18 [4];
  
  local_18[2] = 5;
  local_18[1] = 5;
  local_18[0] = (timeout + 4) / 5;
  local_18[3] = 1;
  iVar1 = setsockopt(this->mFd,1,9,local_18 + 3,4);
  if (iVar1 == 0) {
    iVar1 = setsockopt(this->mFd,6,4,local_18 + 2,4);
    if (iVar1 == 0) {
      iVar1 = setsockopt(this->mFd,6,5,local_18 + 1,4);
      if (iVar1 == 0) {
        iVar1 = setsockopt(this->mFd,6,6,local_18,4);
        if (iVar1 == 0) {
          return true;
        }
        fmt = "Failed keepcnt";
        level = 2;
        iVar1 = 0x2d0;
      }
      else {
        fmt = "Failed keepintvl";
        level = 2;
        iVar1 = 0x2c8;
      }
    }
    else {
      fmt = "Failed keepidle";
      level = 3;
      iVar1 = 0x2c0;
    }
  }
  else {
    fmt = "Failed to set SO_KEEPALIVE";
    level = 3;
    iVar1 = 0x2b8;
  }
  jh_log_print(level,"bool JetHead::Socket::setKeepAlive(int)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
               ,iVar1,fmt);
  return false;
}

Assistant:

bool Socket::setKeepAlive(int timeout)
{
#ifdef PLATFORM_DARWIN
	return false;
#else
	// How long must the connection be idle before we start the
	// keepalive checking?
	int aliveTime = 5;

	// At what interval (in seconds) do we send out addtional probes?
	int interval = 5;
	
	// The number of probes is the timeout / interval, rounded up.
	int probes = (timeout + (interval - 1)) / interval;

	// setsockopt requires pointers to values, thus lame
	int one = 1;

	// First we have to set SO_KEEPALIVE so that the socket layer
	// knows that there are keepalive options.  (The details of those
	// options are protocol specific.)
	if ( setsockopt(mFd, SOL_SOCKET, SO_KEEPALIVE, &one, 
					sizeof(one)) != 0 )
	{
		LOG_WARN_PERROR("Failed to set SO_KEEPALIVE");
		return false;
	}

	// Set the idle time
	if ( setsockopt(mFd, IPPROTO_TCP, TCP_KEEPIDLE, &aliveTime, 
					sizeof(aliveTime)) != 0 )
	{
		LOG_WARN_PERROR("Failed keepidle");
		return false;
	}

	// Set the probe interval
	if (setsockopt( mFd, IPPROTO_TCP, TCP_KEEPINTVL, &interval, 
					sizeof(interval)) != 0 )
	{
		LOG_WARN("Failed keepintvl");
		return false;
	}

	// Set the number of probes
	if (setsockopt( mFd, IPPROTO_TCP, TCP_KEEPCNT, &probes,     
					sizeof(probes)) != 0 )
	{
		LOG_WARN("Failed keepcnt");
		return false;
	}
	
	// We win
	return true;
#endif
}